

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O0

ssize_t __thiscall VCProjectWriter::write(VCProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  bool bVar2;
  XmlOutput *name;
  XmlOutput *toTag;
  undefined4 in_register_00000034;
  xml_output *this_00;
  long in_FS_OFFSET;
  QString *in_stack_fffffffffffffeb8;
  int v;
  char *in_stack_fffffffffffffec0;
  xml_output *in_stack_fffffffffffffee8;
  XmlOutput *in_stack_fffffffffffffef0;
  
  this_00 = (xml_output *)CONCAT44(in_register_00000034,__fd);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QString::isEmpty((QString *)0x27c9e9);
  if (!bVar2) {
    tag(in_stack_fffffffffffffeb8);
    v = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
    name = XmlOutput::operator<<(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    attrS((char *)name,(QString *)this_00);
    XmlOutput::operator<<(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    attrE(in_stack_fffffffffffffec0,v);
    toTag = XmlOutput::operator<<(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    attrS((char *)name,(QString *)this_00);
    XmlOutput::operator<<(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    closetag((QString *)toTag);
    XmlOutput::operator<<(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    XmlOutput::xml_output::~xml_output(this_00);
    XmlOutput::xml_output::~xml_output(this_00);
    XmlOutput::xml_output::~xml_output(this_00);
    XmlOutput::xml_output::~xml_output(this_00);
    XmlOutput::xml_output::~xml_output(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void VCProjectWriter::write(XmlOutput &xml, const VCDeploymentTool &tool)
{
    if (tool.AdditionalFiles.isEmpty())
        return;
    xml << tag(tool.DeploymentTag)
        << attrS(_RemoteDirectory, tool.RemoteDirectory)
        << attrE(_RegisterOutput, tool.RegisterOutput)
        << attrS(_AdditionalFiles, tool.AdditionalFiles)
        << closetag(tool.DeploymentTag);
}